

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

args * djb::microfacet::args::normalmap
                 (args *__return_storage_ptr__,vec3 *n,float_t a1,float_t a2,float_t phi_a)

{
  float_t local_30;
  float_t local_2c;
  float_t cor;
  float_t ay;
  float_t ax;
  float_t tyn;
  float_t txn;
  float_t phi_a_local;
  float_t a2_local;
  float_t a1_local;
  vec3 *n_local;
  
  tyn = phi_a;
  txn = a2;
  phi_a_local = a1;
  _a2_local = n;
  if (n->z <= 0.0) {
    __assert_fail("n.z > 0 && \"invalid normal direction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x4d0,
                  "static microfacet::args djb::microfacet::args::normalmap(const vec3 &, float_t, float_t, float_t)"
                 );
  }
  ax = -n->x / n->z;
  ay = -n->y / n->z;
  ellipse_to_p22args(a1,a2,phi_a,&cor,&local_2c,&local_30);
  p22args(__return_storage_ptr__,cor,local_2c,local_30,ax,ay);
  return __return_storage_ptr__;
}

Assistant:

microfacet::args
microfacet::args::normalmap(
	const vec3 &n, float_t a1, float_t a2, float_t phi_a
) {
	DJB_ASSERT(n.z > 0 && "invalid normal direction");
	float_t txn = -n.x / n.z;
	float_t tyn = -n.y / n.z;
	float_t ax, ay, cor;
	ellipse_to_p22args(a1, a2, phi_a, &ax, &ay, &cor);

	return microfacet::args::p22args(ax, ay, cor, txn, tyn);
}